

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_checker.c
# Opt level: O1

uint8_t cio_check_utf8(cio_utf8_state *state,uint8_t *string,size_t count)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  uint8_t *puVar7;
  long lVar8;
  byte bVar9;
  undefined8 local_28;
  uint8_t buffer [8];
  
  if (count < 8) {
    uVar6 = 0;
    uVar4 = count & 0xffffffff;
    uVar3 = 0;
  }
  else {
    uVar4 = (ulong)(-(int)string & 7);
    uVar6 = count - uVar4 >> 3;
    uVar3 = (uint)(count - uVar4) & 7;
  }
  if ((int)uVar4 != 0) {
    bVar9 = state->codepoint;
    bVar5 = state->state;
    lVar8 = 0;
    do {
      bVar1 = string[lVar8];
      bVar2 = ""[bVar1];
      if (bVar5 == 0) {
        bVar9 = (byte)(0xff >> (bVar2 & 0x1f)) & bVar1;
      }
      else {
        bVar9 = bVar9 << 6 | bVar1 & 0x3f;
      }
      state->codepoint = bVar9;
      bVar5 = ""[(ulong)bVar2 + (ulong)bVar5 + 0x100];
      state->state = bVar5;
      if (bVar5 == 0xc) {
        return '\f';
      }
      lVar8 = lVar8 + 1;
    } while ((int)uVar4 != (int)lVar8);
  }
  if (uVar6 != 0) {
    puVar7 = string + uVar4;
    bVar9 = state->codepoint;
    bVar5 = state->state;
    do {
      uVar6 = uVar6 - 1;
      local_28 = *(undefined8 *)puVar7;
      puVar7 = puVar7 + 8;
      lVar8 = 0;
      do {
        bVar1 = *(byte *)((long)&local_28 + lVar8);
        if (bVar5 == 0) {
          bVar9 = (byte)(0xff >> (""[bVar1] & 0x1f)) & bVar1;
        }
        else {
          bVar9 = bVar9 << 6 | bVar1 & 0x3f;
        }
        bVar5 = ""[(ulong)""[bVar1] + (ulong)bVar5 + 0x100];
        if (bVar5 == 0xc) {
          state->state = '\f';
          state->codepoint = bVar9;
          return '\f';
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      state->state = bVar5;
      state->codepoint = bVar9;
    } while (uVar6 != 0);
  }
  if (uVar3 != 0) {
    bVar9 = state->codepoint;
    bVar5 = state->state;
    lVar8 = 0;
    do {
      bVar1 = string[lVar8 + (count - uVar3)];
      bVar2 = ""[bVar1];
      if (bVar5 == 0) {
        bVar9 = (byte)(0xff >> (bVar2 & 0x1f)) & bVar1;
      }
      else {
        bVar9 = bVar9 << 6 | bVar1 & 0x3f;
      }
      state->codepoint = bVar9;
      bVar5 = ""[(ulong)bVar2 + (ulong)bVar5 + 0x100];
      state->state = bVar5;
      if (bVar5 == 0xc) {
        return '\f';
      }
      lVar8 = lVar8 + 1;
    } while (uVar3 != (uint)lVar8);
  }
  return state->state;
}

Assistant:

uint8_t cio_check_utf8(struct cio_utf8_state *state, const uint8_t *string, size_t count)
{
	const uint_fast32_t *s_aligned = NULL;
	unsigned int pre_length = (unsigned int)count;
	size_t main_length = 0;
	unsigned int post_length = 0;

	if (count >= sizeof(*s_aligned)) {
		pre_length = ((uintptr_t)string) % sizeof(*s_aligned);
		pre_length = (sizeof(*s_aligned) - pre_length) % sizeof(*s_aligned);
		main_length = (count - pre_length) / sizeof(*s_aligned);
		post_length = (unsigned int)(count - pre_length - (main_length * sizeof(*s_aligned)));
	}

	s_aligned = (const void *)(string + pre_length);

	size_t i_p = 0;
	while (pre_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		pre_length--;
		i_p++;
	}

	while (main_length-- > 0) {
		uint8_t buffer[sizeof(uint_fast32_t)];
		memcpy(buffer, s_aligned, sizeof(buffer));
		s_aligned++;
		for (uint_fast8_t i = 0; i < (uint_fast8_t)sizeof(buffer); i++) {
			uint8_t character = buffer[i];
			if (decode(&state->state, &state->codepoint, character) == CIO_UTF8_REJECT) {
				return CIO_UTF8_REJECT;
			}
		}
	}

	i_p = count - post_length;
	while (post_length > 0) {
		if (decode(&state->state, &state->codepoint, string[i_p]) == CIO_UTF8_REJECT) {
			return CIO_UTF8_REJECT;
		}

		post_length--;
		i_p++;
	}

	return state->state;
}